

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t despace(char *bytes,size_t howmany)

{
  char cVar1;
  ulong uStack_28;
  char c;
  size_t i;
  size_t pos;
  size_t howmany_local;
  char *bytes_local;
  
  i = 0;
  for (uStack_28 = 0; uStack_28 < howmany; uStack_28 = uStack_28 + 1) {
    cVar1 = bytes[uStack_28];
    if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
      bytes[i] = cVar1;
      i = i + 1;
    }
  }
  return i;
}

Assistant:

size_t despace(char *bytes, size_t howmany) {
  size_t pos = 0;
  for (size_t i = 0; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}